

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O1

void __thiscall TString::ToUpperCase(TString *this)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  
  pcVar1 = this->myString;
  cVar2 = *pcVar1;
  if (cVar2 != '\0') {
    lVar3 = 1;
    do {
      if ((byte)(cVar2 + 0x9fU) < 0x1a) {
        *pcVar1 = cVar2 + -0x20;
      }
      cVar2 = this->myString[lVar3];
      pcVar1 = this->myString + lVar3;
      lVar3 = lVar3 + 1;
    } while (cVar2 != '\0');
  }
  return;
}

Assistant:

void TString::ToUpperCase(void)
{
	for(int i = 0; *(myString + i) != '\0'; i++)
		if(*(myString + i) >= 'a' && *(myString + i) <= 'z')
			*(myString + i) += 'A' - 'a';
}